

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void writeint(char *outfile,int a)

{
  int in_ESI;
  char *in_RDI;
  uchar b [4];
  int i;
  int in_stack_ffffffffffffffec;
  int iVar1;
  
  for (iVar1 = 3; -1 < iVar1; iVar1 = iVar1 + -1) {
    (&stack0xffffffffffffffec)[iVar1] = (char)in_ESI;
    in_ESI = in_ESI >> 8;
  }
  for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
    qwrite(in_RDI,(char *)CONCAT44(in_ESI,iVar1),in_stack_ffffffffffffffec);
  }
  return;
}

Assistant:

static void
writeint(char *outfile, int a)
{
int i;
unsigned char b[4];

	/* Write integer A one byte at a time to outfile.
	 *
	 * This is portable from Vax to Sun since it eliminates the
	 * need for byte-swapping.
	 */
	for (i=3; i>=0; i--) {
		b[i] = a & 0x000000ff;
		a >>= 8;
	}
	for (i=0; i<4; i++) qwrite(outfile, (char *) &b[i],1);
}